

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB2_MultiGFab.cpp
# Opt level: O1

MultiFab * __thiscall
amrex::EB2::MultiGFab::getLevelSet(MultiFab *__return_storage_ptr__,MultiGFab *this)

{
  int iVar1;
  int ncomp;
  pointer pGVar2;
  double *p;
  int *piVar3;
  MFIter mfi;
  FabFactory<amrex::FArrayBox> local_f8;
  BoxArray local_f0;
  undefined1 local_88 [24];
  pointer pbStack_70;
  pointer local_68;
  IntVect local_40;
  
  local_40.vect[0] = 1;
  local_40.vect[1] = 1;
  local_40.vect[2] = 1;
  convert(&local_f0,&(this->super_LayoutData<amrex::EB2::GFab>).super_FabArrayBase.boxarray,
          &local_40);
  local_88._16_8_ = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  local_88._0_8_ = (_func_int **)0x0;
  local_88._8_8_ = (Arena *)0x0;
  local_68 = (pointer)0x0;
  local_f8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
  MultiFab::MultiFab(__return_storage_ptr__,&local_f0,
                     &(this->super_LayoutData<amrex::EB2::GFab>).super_FabArrayBase.distributionMap,
                     1,2,(MFInfo *)local_88,&local_f8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_88 + 0x10));
  BoxArray::~BoxArray(&local_f0);
  MFIter::MFIter((MFIter *)&local_f0,(FabArrayBase *)this,'\0');
  if (local_f0.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
      local_f0.m_bat.m_op.m_bndryReg.m_hishft.vect[1]) {
    do {
      piVar3 = local_f0.m_bat.m_op.m_bndryReg.m_loshft.vect + 2;
      if ((long *)local_f0.m_bat.m_op._60_8_ != (long *)0x0) {
        piVar3 = (int *)((long)local_f0.m_bat.m_op.m_bndryReg.m_loshft.vect[2] * 4 +
                        *(long *)local_f0.m_bat.m_op._60_8_);
      }
      iVar1 = *piVar3;
      pGVar2 = (this->super_LayoutData<amrex::EB2::GFab>).m_data.
               super_vector<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>.
               super__Vector_base<amrex::EB2::GFab,_std::allocator<amrex::EB2::GFab>_>._M_impl.
               super__Vector_impl_data._M_start;
      ncomp = pGVar2[iVar1].m_levelset.nvar;
      p = BaseFab<double>::dataPtr(&pGVar2[iVar1].m_levelset,0);
      FArrayBox::FArrayBox((FArrayBox *)local_88,&pGVar2[iVar1].m_levelset.domain,ncomp,p);
      FabArray<amrex::FArrayBox>::setFab<amrex::FArrayBox,_0>
                (&__return_storage_ptr__->super_FabArray<amrex::FArrayBox>,(MFIter *)&local_f0,
                 (FArrayBox *)local_88);
      local_88._0_8_ = &PTR__BaseFab_0074eb90;
      BaseFab<double>::clear((BaseFab<double> *)local_88);
      MFIter::operator++((MFIter *)&local_f0);
    } while (local_f0.m_bat.m_op.m_bndryReg.m_loshft.vect[2] <
             local_f0.m_bat.m_op.m_bndryReg.m_hishft.vect[1]);
  }
  MFIter::~MFIter((MFIter *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

MultiFab
MultiGFab::getLevelSet ()
{
    MultiFab r(amrex::convert(boxArray(),IntVect::TheNodeVector()),
               DistributionMap(), 1, GFab::ng, MFInfo().SetAlloc(false));

    for (MFIter mfi(*this); mfi.isValid(); ++mfi) {
        auto& fab = (*this)[mfi].getLevelSet();
        r.setFab(mfi, FArrayBox(fab.box(), fab.nComp(), fab.dataPtr()));
    }

    return r;
}